

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.cpp
# Opt level: O1

void __thiscall CIdPtrExp::CIdPtrExp(CIdPtrExp *this,string *name,int *address)

{
  (this->super_IExpression).super_PositionedNode.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_001821a8;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->address = address;
  return;
}

Assistant:

CIdPtrExp::CIdPtrExp( const std::string &name, int *address ) {
    this->name = name;
    this->address = address;
}